

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_SWEEP(effect_handler_context_t *context)

{
  loc grid;
  monster *pmVar1;
  long lVar2;
  _Bool fear;
  _Bool local_39;
  anon_enum_32 local_38;
  wchar_t local_34;
  
  local_34 = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  local_38 = (context->origin).what;
  if (local_38 == SRC_PLAYER) {
    while (L'\0' < local_34) {
      local_34 = local_34 + L'\xffffffff';
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        grid = (loc)loc_sum(player->grid,(loc_conflict)clockwise_grid[lVar2]);
        pmVar1 = square_monster(cave,grid);
        if (pmVar1 != (monster *)0x0) {
          py_attack_real(player,grid,&local_39);
        }
      }
    }
  }
  return local_38 == SRC_PLAYER;
}

Assistant:

bool effect_handler_SWEEP(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	bool fear;
	int i;
	struct loc target;

	/* Players only for now */
	if (context->origin.what != SRC_PLAYER)	return false;

	/* Doing these like >1 blows means spinning around multiple times. */
	while (blows-- > 0) {
		for (i = 0; i < 8; i++) {
			target = loc_sum(player->grid, clockwise_grid[i]);
			if (square_monster(cave, target) != NULL)
				py_attack_real(player, target, &fear);
		}
	}

	/* Should return some energy if all enemies killed and blows remain? */
	return true;
}